

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

int xmlParse3986URIReference(xmlURIPtr uri,char *str)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  byte bVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  byte *pbVar8;
  char *cur;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  if (str == (char *)0x0) {
    return -1;
  }
  xmlCleanURI(uri);
  local_38 = (byte *)str;
  if ((byte)((*str & 0xdfU) + 0xbf) < 0x1a) {
    lVar7 = 0;
    while (((bVar4 = str[lVar7 + 1], (byte)(bVar4 - 0x30) < 10 ||
            ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)) ||
           ((bVar4 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar4 & 0x3f) & 1) != 0))))) {
      lVar7 = lVar7 + 1;
    }
    if (uri != (xmlURIPtr)0x0) {
      if (uri->scheme != (char *)0x0) {
        (*xmlFree)(uri->scheme);
      }
      pxVar3 = xmlStrndup((xmlChar *)str,(int)lVar7 + 1);
      uri->scheme = (char *)pxVar3;
      bVar4 = str[lVar7 + 1];
    }
    if (bVar4 != 0x3a) goto LAB_0018a2f0;
    pbVar8 = (byte *)(str + lVar7 + 2);
    bVar4 = *pbVar8;
    local_48 = pbVar8;
    if (bVar4 != 0x2f) {
      if ((9 < (byte)(bVar4 - 0x30)) && (0x19 < (byte)((bVar4 & 0xdf) + 0xbf))) {
        uVar5 = bVar4 - 0x21;
        if (uVar5 < 0x3f) {
          if ((0x4000000096003fe9U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
            if ((ulong)uVar5 != 4) goto LAB_0018a25a;
            if ((((byte)(str[lVar7 + 3] - 0x30U) < 10) ||
                ((uVar5 = (byte)str[lVar7 + 3] - 0x41, uVar5 < 0x26 &&
                 ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))) &&
               (((byte)(str[lVar7 + 4] - 0x30U) < 10 ||
                ((uVar5 = (byte)str[lVar7 + 4] - 0x41, uVar5 < 0x26 &&
                 ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))))) goto LAB_0018a147;
            goto LAB_0018a263;
          }
        }
        else {
LAB_0018a25a:
          if (bVar4 != 0x7e) {
LAB_0018a263:
            pbVar6 = pbVar8;
            if (uri != (xmlURIPtr)0x0) {
              if (uri->path != (char *)0x0) {
                (*xmlFree)(uri->path);
              }
              uri->path = (char *)0x0;
            }
            goto LAB_0018a293;
          }
        }
      }
LAB_0018a147:
      local_40 = pbVar8;
      iVar1 = xmlParse3986Segment((char **)&local_40,'\0',0);
      if (iVar1 == 0) {
        do {
          pbVar6 = local_40;
          if (*local_40 != 0x2f) {
            if (uri != (xmlURIPtr)0x0) {
              if (uri->path != (char *)0x0) {
                (*xmlFree)(uri->path);
              }
              if (pbVar8 == pbVar6) {
                pxVar3 = (xmlChar *)0x0;
              }
              else {
                iVar1 = ((-2 - (int)str) + (int)pbVar6) - (int)lVar7;
                if ((uri->cleanup & 2) == 0) {
                  pxVar3 = (xmlChar *)xmlURIUnescapeString((char *)pbVar8,iVar1,(char *)0x0);
                }
                else {
                  pxVar3 = xmlStrndup(pbVar8,iVar1);
                }
              }
              uri->path = (char *)pxVar3;
            }
            goto LAB_0018a293;
          }
          local_40 = local_40 + 1;
          iVar1 = xmlParse3986Segment((char **)&local_40,'\0',1);
        } while (iVar1 == 0);
      }
      goto LAB_0018a2f0;
    }
    if (str[lVar7 + 3] == '/') {
      local_48 = (byte *)(str + lVar7 + 4);
      iVar1 = xmlParse3986Authority(uri,(char **)&local_48);
      if (iVar1 != 0) goto LAB_0018a2f0;
      if (uri->server == (char *)0x0) {
        uri->port = -1;
      }
      iVar1 = xmlParse3986PathAbEmpty(uri,(char **)&local_48);
    }
    else {
      iVar1 = xmlParse3986PathAbsolute(uri,(char **)&local_48);
    }
    pbVar6 = local_48;
    if (iVar1 != 0) goto LAB_0018a2f0;
LAB_0018a293:
    bVar4 = *pbVar6;
    local_38 = pbVar6;
    if (bVar4 == 0x3f) {
      local_38 = pbVar6 + 1;
      iVar1 = xmlParse3986Query(uri,(char **)&local_38);
      if (iVar1 != 0) goto LAB_0018a2f0;
      bVar4 = *local_38;
    }
    if (bVar4 == 0x23) {
      local_38 = local_38 + 1;
      iVar1 = xmlParse3986Fragment(uri,(char **)&local_38);
      if (iVar1 != 0) goto LAB_0018a2f0;
      bVar4 = *local_38;
    }
    if (bVar4 != 0) {
      xmlCleanURI(uri);
      goto LAB_0018a2f0;
    }
LAB_0018a533:
    iVar2 = 0;
  }
  else {
LAB_0018a2f0:
    xmlCleanURI(uri);
    bVar4 = *str;
    local_48 = (byte *)str;
    if (bVar4 == 0x2f) {
      if (str[1] == '/') {
        local_48 = (byte *)(str + 2);
        iVar2 = xmlParse3986Authority(uri,(char **)&local_48);
        if (iVar2 == 0) {
          iVar1 = xmlParse3986PathAbEmpty(uri,(char **)&local_48);
          goto LAB_0018a3c9;
        }
      }
      else {
        iVar1 = xmlParse3986PathAbsolute(uri,(char **)&local_48);
LAB_0018a3c9:
        iVar2 = 1;
        if (iVar1 == 0) goto LAB_0018a4b9;
      }
    }
    else {
      if (((byte)(bVar4 - 0x30) < 10) || ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)) {
LAB_0018a371:
        local_40 = (byte *)str;
        iVar1 = xmlParse3986Segment((char **)&local_40,':',0);
        if (iVar1 == 0) {
          do {
            pbVar8 = local_40;
            if (*local_40 != 0x2f) {
              if (uri != (xmlURIPtr)0x0) {
                if (uri->path != (char *)0x0) {
                  (*xmlFree)(uri->path);
                }
                if (pbVar8 == (byte *)str) {
                  pxVar3 = (xmlChar *)0x0;
                }
                else {
                  iVar1 = (int)pbVar8 - (int)str;
                  if ((uri->cleanup & 2) == 0) {
                    pxVar3 = (xmlChar *)xmlURIUnescapeString(str,iVar1,(char *)0x0);
                  }
                  else {
                    pxVar3 = xmlStrndup((xmlChar *)str,iVar1);
                  }
                }
                uri->path = (char *)pxVar3;
              }
              local_48 = pbVar8;
              goto LAB_0018a4b9;
            }
            local_40 = local_40 + 1;
            iVar1 = xmlParse3986Segment((char **)&local_40,'\0',1);
          } while (iVar1 == 0);
        }
      }
      else {
        uVar5 = bVar4 - 0x21;
        if (uVar5 < 0x3f) {
          if ((0x4000000096003fe9U >> ((ulong)uVar5 & 0x3f) & 1) != 0) goto LAB_0018a371;
          if ((ulong)uVar5 != 4) goto LAB_0018a47f;
          if ((((byte)(str[1] - 0x30U) < 10) ||
              ((uVar5 = (byte)str[1] - 0x41, uVar5 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))) &&
             (((byte)(str[2] - 0x30U) < 10 ||
              ((uVar5 = (byte)str[2] - 0x41, uVar5 < 0x26 &&
               ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) != 0)))))) goto LAB_0018a371;
        }
        else {
LAB_0018a47f:
          if (bVar4 == 0x7e) goto LAB_0018a371;
        }
        if (uri != (xmlURIPtr)0x0) {
          if (uri->path != (char *)0x0) {
            (*xmlFree)(uri->path);
          }
          uri->path = (char *)0x0;
        }
LAB_0018a4b9:
        bVar4 = *local_48;
        if (bVar4 == 0x3f) {
          local_48 = local_48 + 1;
          iVar1 = xmlParse3986Query(uri,(char **)&local_48);
          iVar2 = -1;
          if (iVar1 != 0) goto LAB_0018a51a;
          bVar4 = *local_48;
        }
        if (bVar4 == 0x23) {
          local_48 = local_48 + 1;
          iVar1 = xmlParse3986Fragment(uri,(char **)&local_48);
          iVar2 = -1;
          if (iVar1 != 0) goto LAB_0018a51a;
          bVar4 = *local_48;
        }
        if (bVar4 == 0) goto LAB_0018a533;
        xmlCleanURI(uri);
      }
      iVar2 = 1;
    }
LAB_0018a51a:
    xmlCleanURI(uri);
  }
  return iVar2;
}

Assistant:

static int
xmlParse3986URIReference(xmlURIPtr uri, const char *str) {
    int ret;

    if (str == NULL)
	return(-1);
    xmlCleanURI(uri);

    /*
     * Try first to parse absolute refs, then fallback to relative if
     * it fails.
     */
    ret = xmlParse3986URI(uri, str);
    if (ret != 0) {
	xmlCleanURI(uri);
        ret = xmlParse3986RelativeRef(uri, str);
	if (ret != 0) {
	    xmlCleanURI(uri);
	    return(ret);
	}
    }
    return(0);
}